

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O0

UriBool uriAppendQueryItemW(UriQueryListW **prevNext,wchar_t *itemCount,wchar_t *keyFirst,
                           wchar_t *keyAfter,wchar_t *valueFirst,wchar_t *valueAfter,
                           UriBool plusToSpace,UriBreakConversion breakConversion,
                           UriMemoryManager *memory)

{
  int iVar1;
  int iVar2;
  UriQueryListW *pUVar3;
  wchar_t *inout;
  wchar_t *local_58;
  wchar_t *value;
  wchar_t *key;
  wchar_t valueLen;
  wchar_t keyLen;
  wchar_t *valueAfter_local;
  wchar_t *valueFirst_local;
  wchar_t *keyAfter_local;
  wchar_t *keyFirst_local;
  wchar_t *itemCount_local;
  UriQueryListW **prevNext_local;
  
  iVar1 = (int)((long)keyAfter - (long)keyFirst >> 2);
  iVar2 = (int)((long)valueAfter - (long)valueFirst >> 2);
  if (((((prevNext == (UriQueryListW **)0x0) || (itemCount == (wchar_t *)0x0)) ||
       (keyFirst == (wchar_t *)0x0)) || ((keyAfter == (wchar_t *)0x0 || (keyAfter < keyFirst)))) ||
     ((valueAfter < valueFirst ||
      (((keyFirst == keyAfter && (valueFirst == (wchar_t *)0x0)) && (valueAfter == (wchar_t *)0x0)))
      ))) {
    prevNext_local._4_4_ = 1;
  }
  else {
    pUVar3 = (UriQueryListW *)(*memory->malloc)(memory,0x18);
    *prevNext = pUVar3;
    if (*prevNext == (UriQueryListW *)0x0) {
      prevNext_local._4_4_ = 0;
    }
    else {
      (*prevNext)->next = (UriQueryListStructW *)0x0;
      inout = (wchar_t *)(*memory->malloc)(memory,(long)(iVar1 + 1) << 2);
      if (inout == (wchar_t *)0x0) {
        (*memory->free)(memory,*prevNext);
        *prevNext = (UriQueryListW *)0x0;
        prevNext_local._4_4_ = 0;
      }
      else {
        inout[iVar1] = L'\0';
        if (0 < iVar1) {
          memcpy(inout,keyFirst,(long)iVar1 << 2);
          uriUnescapeInPlaceExW(inout,plusToSpace,breakConversion);
        }
        (*prevNext)->key = inout;
        if (valueFirst == (wchar_t *)0x0) {
          local_58 = (wchar_t *)0x0;
        }
        else {
          local_58 = (wchar_t *)(*memory->malloc)(memory,(long)(iVar2 + 1) << 2);
          if (local_58 == (wchar_t *)0x0) {
            (*memory->free)(memory,inout);
            (*memory->free)(memory,*prevNext);
            *prevNext = (UriQueryListW *)0x0;
            return 0;
          }
          local_58[iVar2] = L'\0';
          if (0 < iVar2) {
            memcpy(local_58,valueFirst,(long)iVar2 << 2);
            uriUnescapeInPlaceExW(local_58,plusToSpace,breakConversion);
          }
          (*prevNext)->value = local_58;
        }
        (*prevNext)->value = local_58;
        *itemCount = *itemCount + L'\x01';
        prevNext_local._4_4_ = 1;
      }
    }
  }
  return prevNext_local._4_4_;
}

Assistant:

UriBool URI_FUNC(AppendQueryItem)(URI_TYPE(QueryList) ** prevNext,
		int * itemCount, const URI_CHAR * keyFirst, const URI_CHAR * keyAfter,
		const URI_CHAR * valueFirst, const URI_CHAR * valueAfter,
		UriBool plusToSpace, UriBreakConversion breakConversion,
		UriMemoryManager * memory) {
	const int keyLen = (int)(keyAfter - keyFirst);
	const int valueLen = (int)(valueAfter - valueFirst);
	URI_CHAR * key;
	URI_CHAR * value;

	if ((prevNext == NULL) || (itemCount == NULL)
			|| (keyFirst == NULL) || (keyAfter == NULL)
			|| (keyFirst > keyAfter) || (valueFirst > valueAfter)
			|| ((keyFirst == keyAfter)
				&& (valueFirst == NULL) && (valueAfter == NULL))) {
		return URI_TRUE;
	}

	/* Append new empty item */
	*prevNext = memory->malloc(memory, 1 * sizeof(URI_TYPE(QueryList)));
	if (*prevNext == NULL) {
		return URI_FALSE; /* Raises malloc error */
	}
	(*prevNext)->next = NULL;


	/* Fill key */
	key = memory->malloc(memory, (keyLen + 1) * sizeof(URI_CHAR));
	if (key == NULL) {
		memory->free(memory, *prevNext);
		*prevNext = NULL;
		return URI_FALSE; /* Raises malloc error */
	}

	key[keyLen] = _UT('\0');
	if (keyLen > 0) {
		/* Copy 1:1 */
		memcpy(key, keyFirst, keyLen * sizeof(URI_CHAR));

		/* Unescape */
		URI_FUNC(UnescapeInPlaceEx)(key, plusToSpace, breakConversion);
	}
	(*prevNext)->key = key;


	/* Fill value */
	if (valueFirst != NULL) {
		value = memory->malloc(memory, (valueLen + 1) * sizeof(URI_CHAR));
		if (value == NULL) {
			memory->free(memory, key);
			memory->free(memory, *prevNext);
			*prevNext = NULL;
			return URI_FALSE; /* Raises malloc error */
		}

		value[valueLen] = _UT('\0');
		if (valueLen > 0) {
			/* Copy 1:1 */
			memcpy(value, valueFirst, valueLen * sizeof(URI_CHAR));

			/* Unescape */
			URI_FUNC(UnescapeInPlaceEx)(value, plusToSpace, breakConversion);
		}
		(*prevNext)->value = value;
	} else {
		value = NULL;
	}
	(*prevNext)->value = value;

	(*itemCount)++;
	return URI_TRUE;
}